

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O2

void __thiscall MyServerConnection::OnClose(MyServerConnection *this,SDKJsonResult *reason)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  TonkStatusEx status;
  string asStack_238 [32];
  TonkStatusEx local_218;
  LogStringBuffer local_198;
  
  tonk::SDKConnection::GetStatusEx(&local_218,&this->super_SDKConnection);
  tonk_file_free(this->File);
  std::__cxx11::string::string(asStack_238,(string *)&reason->ErrorJson);
  if ((int)Logger.ChannelMinLevel < 3) {
    this_00 = &local_198.LogStream;
    local_198.ChannelName = Logger.ChannelName;
    local_198.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&Logger.Prefix);
    std::operator<<((ostream *)this_00,"Disconnected from ");
    std::operator<<((ostream *)this_00,local_218.Remote.NetworkString);
    std::operator<<((ostream *)this_00," : ");
    std::ostream::operator<<((ostream *)this_00,local_218.Remote.UDPPort);
    std::operator<<((ostream *)this_00," - Reason = ");
    std::operator<<((ostream *)this_00,asStack_238);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  std::__cxx11::string::~string(asStack_238);
  return;
}

Assistant:

void MyServerConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    auto status = GetStatusEx();

    tonk_file_free(File);

    Logger.Info("Disconnected from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort, " - Reason = ", reason.ToString());
}